

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCaseInstance::uploadSparseImage
          (ShaderRenderCaseInstance *this,TextureFormat *texFormat,TextureData *textureData,
          Sampler *refSampler,deUint32 mipLevels,deUint32 arrayLayers,VkImage sparseImage,
          VkImageCreateInfo *imageCreateInfo,UVec3 texSize)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  deUint64 dVar7;
  Allocator *pAVar8;
  uint uVar9;
  VkBuffer buffer;
  VkBuffer obj;
  void *pvVar10;
  VkDeviceSize VVar11;
  VkDeviceSize VVar12;
  pointer pVVar13;
  pointer pVVar14;
  pointer pVVar15;
  bool bVar16;
  deUint32 dVar17;
  uint uVar18;
  deUint32 dVar19;
  int iVar20;
  uint uVar21;
  VkResult VVar22;
  deUint32 dVar23;
  DeviceDriver *vk;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vk_00;
  pointer pvVar24;
  NotSupportedError *pNVar25;
  pointer pvVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  deUint32 dVar32;
  long lVar33;
  TextureFormat *format;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  pointer pCVar40;
  ulong uVar41;
  ConstPixelBufferAccess *access;
  long lVar42;
  ulong uVar43;
  VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;
  VkDeviceSize VStack_8d0;
  uint local_8b4;
  uint local_8b0;
  VkSparseMemoryBind imageMipTailMemoryBind;
  ulong uStack_870;
  VkDevice local_848;
  VkSparseImageMemoryBindInfo imageResidencyBindInfo;
  ulong local_7f0;
  vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> imageMipTailMemoryBinds;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  sparseImageMemoryRequirements;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copyRegions;
  VkQueue local_730;
  ulong local_728;
  VkSubmitInfo submitInfo;
  deUint32 sparseMemoryReqCount;
  undefined4 uStack_684;
  Deleter<vk::Handle<(vk::HandleType)8>_> local_680;
  vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
  imageResidencyMemoryBinds;
  long *local_628 [2];
  VkSemaphore local_618;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_610;
  long local_5f8;
  long local_5f0;
  VkDeviceSize local_5e8;
  ulong local_5e0;
  VkPipelineStageFlags pipelineStageFlags;
  VkBufferCreateInfo bufferParams;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  VkPhysicalDeviceMemoryProperties deviceMemoryProperties;
  VkPhysicalDeviceProperties deviceProperties;
  
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    local_848 = (((this->m_sparseContext).
                  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                  .m_data.ptr)->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
LAB_006534dd:
    vk = &((this->m_sparseContext).
           super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
           .m_data.ptr)->m_deviceInterface;
  }
  else {
    local_848 = Context::getDevice((this->super_TestInstance).m_context);
    if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) goto LAB_006534dd;
    vk = (DeviceDriver *)Context::getDeviceInterface((this->super_TestInstance).m_context);
  }
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    local_730 = ((this->m_sparseContext).
                 super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                 .m_data.ptr)->m_queue;
  }
  else {
    local_730 = Context::getUniversalQueue((this->super_TestInstance).m_context);
    if (this->m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE) {
      dVar23 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
      goto LAB_00653547;
    }
  }
  dVar23 = ((this->m_sparseContext).
            super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
            .m_data.ptr)->m_queueFamilyIndex;
LAB_00653547:
  vk_00 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceProperties(&deviceProperties,vk_00,physicalDevice);
  ::vk::getPhysicalDeviceMemoryProperties(&deviceMemoryProperties,vk_00,physicalDevice);
  dVar17 = 2 - (refSampler->compare == COMPAREMODE_NONE);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&imageMipTailMemoryBind,
             &vk->super_DeviceInterface,local_848,0,(VkAllocationCallbacks *)0x0);
  DStack_610.m_device = (VkDevice)imageMipTailMemoryBind.memory.m_internal;
  DStack_610.m_allocator = (VkAllocationCallbacks *)imageMipTailMemoryBind.memoryOffset;
  local_618.m_internal = imageMipTailMemoryBind.resourceOffset;
  DStack_610.m_deviceIface = (DeviceInterface *)imageMipTailMemoryBind.size;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imageMipTailMemoryBind.resourceOffset = CONCAT44(imageMipTailMemoryBind.resourceOffset._4_4_,4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&offsetMultiples,(iterator)0x0,(uint *)&imageMipTailMemoryBind);
  uVar18 = tcu::TextureFormat::getPixelSize(texFormat);
  imageMipTailMemoryBind.resourceOffset =
       CONCAT44(imageMipTailMemoryBind.resourceOffset._4_4_,uVar18);
  if (offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&offsetMultiples,
               (iterator)
               offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uint *)&imageMipTailMemoryBind);
  }
  else {
    *offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = uVar18;
    offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  bVar16 = isImageSizeSupported
                     (imageCreateInfo->imageType,(UVec3 *)texSize.m_data._0_8_,
                      &deviceProperties.limits);
  if (!bVar16) {
    pNVar25 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar25,"Image size not supported for device.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x59b);
    __cxa_throw(pNVar25,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pvVar26 = (textureData->
            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar24 = (textureData->
            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_728 = 0;
  if (pvVar26 != pvVar24) {
    uVar18 = 0;
    do {
      pCVar40 = (pvVar26->
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pCVar40 !=
          (pvVar26->
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          dVar19 = sr::anon_unknown_0::getNextMultiple
                             ((anon_unknown_0 *)
                              offsetMultiples.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              offsetMultiples.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish,uVar18);
          iVar38 = (pCVar40->m_size).m_data[0];
          iVar2 = (pCVar40->m_size).m_data[1];
          iVar3 = (pCVar40->m_size).m_data[2];
          iVar20 = tcu::TextureFormat::getPixelSize(&pCVar40->m_format);
          uVar18 = iVar3 * iVar20 * iVar2 * iVar38 + dVar19;
          pCVar40 = pCVar40 + 1;
        } while (pCVar40 !=
                 (pvVar26->
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
        pvVar24 = (textureData->
                  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      pvVar26 = pvVar26 + 1;
    } while (pvVar26 != pvVar24);
    local_728 = (ulong)uVar18;
  }
  sparseMemoryReqCount = 0;
  (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x10])
            (vk,local_848,sparseImage.m_internal,&sparseMemoryReqCount,0);
  sparseImageMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sparseImageMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sparseImageMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ::resize(&sparseImageMemoryRequirements,(ulong)sparseMemoryReqCount);
  (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x10])
            (vk,local_848,sparseImage.m_internal,&sparseMemoryReqCount,
             sparseImageMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (sparseMemoryReqCount != 0) {
    lVar42 = 0;
    dVar19 = sparseMemoryReqCount;
    do {
      if ((*(byte *)((long)&((sparseImageMemoryRequirements.
                              super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                              ._M_impl.super__Vector_impl_data._M_start)->formatProperties).
                            aspectMask + lVar42) & 1) != 0) {
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)&submitInfo,&vk->super_DeviceInterface,local_848,
                   sparseImage);
        if (deviceMemoryProperties.memoryTypeCount == 0) goto LAB_00653873;
        uVar39 = 0;
        dVar19 = deviceMemoryProperties.memoryTypeCount;
        goto LAB_0065383d;
      }
      lVar42 = lVar42 + 0x30;
      dVar19 = dVar19 - 1;
    } while (dVar19 != 0);
  }
  pNVar25 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar25,
             "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT."
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
             ,0x5c2);
  __cxa_throw(pNVar25,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
LAB_0065383d:
  if (((submitInfo.waitSemaphoreCount >> ((uint)uVar39 & 0x1f) & 1) != 0) &&
     (bVar16 = ::vk::MemoryRequirement::matchesHeap
                         ((MemoryRequirement *)&::vk::MemoryRequirement::Any,
                          deviceMemoryProperties.memoryTypes[uVar39].propertyFlags),
     dVar19 = deviceMemoryProperties.memoryTypeCount, bVar16)) {
    if ((ulong)submitInfo._0_8_ <= deviceProperties.limits.sparseAddressSpaceSize) {
      ::vk::getPhysicalDeviceSparseImageFormatProperties
                ((vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                  *)&bufferParams,vk_00,physicalDevice,imageCreateInfo->format,
                 imageCreateInfo->imageType,imageCreateInfo->samples,imageCreateInfo->usage,
                 imageCreateInfo->tiling);
      if (bufferParams.pNext == (void *)CONCAT44(bufferParams._4_4_,bufferParams.sType)) {
        pNVar25 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar25,"The image format does not support sparse operations.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                   ,0x5dc);
        __cxa_throw(pNVar25,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      uVar18 = *(uint *)((long)&((sparseImageMemoryRequirements.
                                  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->formatProperties).
                                imageGranularity.width + lVar42);
      uVar4 = *(uint *)((long)&((sparseImageMemoryRequirements.
                                 super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->formatProperties).
                               imageGranularity.height + lVar42);
      uVar5 = *(uint *)((long)&((sparseImageMemoryRequirements.
                                 super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->formatProperties).
                               imageGranularity.depth + lVar42);
      uVar6 = *(uint *)((long)&((sparseImageMemoryRequirements.
                                 super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->formatProperties).flags
                       + lVar42);
      dVar19 = *(deUint32 *)
                ((long)&(sparseImageMemoryRequirements.
                         super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                         ._M_impl.super__Vector_impl_data._M_start)->imageMipTailFirstLod + lVar42);
      local_5e8 = *(VkDeviceSize *)
                   ((long)&(sparseImageMemoryRequirements.
                            super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                            ._M_impl.super__Vector_impl_data._M_start)->imageMipTailSize + lVar42);
      local_5f0 = *(long *)((long)&(sparseImageMemoryRequirements.
                                    super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->imageMipTailOffset +
                           lVar42);
      local_5f8 = *(long *)((long)&(sparseImageMemoryRequirements.
                                    super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->imageMipTailStride +
                           lVar42);
      imageResidencyMemoryBinds.
      super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      imageResidencyMemoryBinds.
      super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      imageResidencyMemoryBinds.
      super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      imageMipTailMemoryBinds.
      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      imageMipTailMemoryBinds.
      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      imageMipTailMemoryBinds.
      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (arrayLayers != 0) {
        local_5e0 = (ulong)arrayLayers;
        local_7f0 = 0;
        do {
          if (dVar19 != 0) {
            dVar32 = 0;
            do {
              bVar27 = (byte)dVar32;
              uVar21 = (imageCreateInfo->extent).width >> (bVar27 & 0x1f);
              uVar21 = uVar21 + (uVar21 == 0);
              uVar35 = (imageCreateInfo->extent).height >> (bVar27 & 0x1f);
              uVar35 = uVar35 + (uVar35 == 0);
              uVar34 = (imageCreateInfo->extent).depth >> (bVar27 & 0x1f);
              uVar34 = uVar34 + (uVar34 == 0);
              uVar36 = uVar21 % uVar18;
              uVar28 = uVar35 % uVar4;
              uVar29 = uVar28;
              if (uVar28 == 0) {
                uVar29 = uVar4;
              }
              uVar37 = uVar36;
              if (uVar36 == 0) {
                uVar37 = uVar18;
              }
              uVar30 = uVar34 % uVar5;
              uVar31 = uVar30;
              if (uVar30 == 0) {
                uVar31 = uVar5;
              }
              uVar34 = (uint)(uVar30 != 0) + uVar34 / uVar5;
              if (uVar34 != 0) {
                uVar21 = uVar21 / uVar18 + (uint)(uVar36 != 0);
                uVar28 = uVar35 / uVar4 + (uint)(uVar28 != 0);
                local_8b4 = 0;
                do {
                  if (uVar28 != 0) {
                    uVar35 = uVar5;
                    if (local_8b4 == uVar34 - 1) {
                      uVar35 = uVar31;
                    }
                    local_8b0 = 0;
                    do {
                      if (uVar21 != 0) {
                        uVar36 = uVar4;
                        if (local_8b0 == uVar28 - 1) {
                          uVar36 = uVar29;
                        }
                        iVar38 = 0;
                        uVar30 = 0;
                        do {
                          imageResidencyBindInfo.image.m_internal = (deUint64)submitInfo.pNext;
                          imageResidencyBindInfo._8_8_ = submitInfo.pNext;
                          imageResidencyBindInfo.pBinds =
                               (VkSparseImageMemoryBind *)
                               CONCAT44(imageResidencyBindInfo.pBinds._4_4_,
                                        submitInfo.waitSemaphoreCount);
                          (*this->m_memAlloc->_vptr_Allocator[3])
                                    (&imageMipTailMemoryBind,this->m_memAlloc,
                                     &imageResidencyBindInfo,0);
                          VVar11 = imageMipTailMemoryBind.resourceOffset;
                          imageMipTailMemoryBind.resourceOffset = 0;
                          imageMipTailBindInfo.bindCount = 0;
                          imageMipTailBindInfo._12_4_ = 0;
                          imageMipTailBindInfo.image.m_internal = VVar11;
                          imageMipTailBindInfo._8_8_ = operator_new(0x20);
                          *(undefined4 *)(imageMipTailBindInfo._8_8_ + 8) = 0;
                          *(undefined4 *)(imageMipTailBindInfo._8_8_ + 0xc) = 0;
                          *(undefined ***)imageMipTailBindInfo._8_8_ = &PTR__SharedPtrState_00d265f8
                          ;
                          *(VkDeviceSize *)(imageMipTailBindInfo._8_8_ + 0x10) = VVar11;
                          *(undefined4 *)(imageMipTailBindInfo._8_8_ + 8) = 1;
                          *(undefined4 *)(imageMipTailBindInfo._8_8_ + 0xc) = 1;
                          std::
                          vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                          ::push_back(&this->m_allocations,(value_type *)&imageMipTailBindInfo);
                          uVar9 = uVar18;
                          if (uVar21 - 1 == uVar30) {
                            uVar9 = uVar37;
                          }
                          imageMipTailMemoryBind.resourceOffset = CONCAT44(dVar32,dVar17);
                          imageMipTailMemoryBind.size = CONCAT44(iVar38,(deUint32)local_7f0);
                          imageMipTailMemoryBind.memory.m_internal =
                               CONCAT44(local_8b4 * uVar5,local_8b0 * uVar4);
                          imageMipTailMemoryBind.memoryOffset = CONCAT44(uVar36,uVar9);
                          imageMipTailMemoryBind.flags = uVar35;
                          dVar7 = *(deUint64 *)(imageMipTailBindInfo.image.m_internal + 8);
                          uStack_870 = uStack_870 & 0xffffffff00000000;
                          if (imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish ==
                              imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::
                            vector<vk::VkSparseImageMemoryBind,std::allocator<vk::VkSparseImageMemoryBind>>
                            ::_M_realloc_insert<vk::VkSparseImageMemoryBind_const&>
                                      ((vector<vk::VkSparseImageMemoryBind,std::allocator<vk::VkSparseImageMemoryBind>>
                                        *)&imageResidencyMemoryBinds,
                                       (iterator)
                                       imageResidencyMemoryBinds.
                                       super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                                       (VkSparseImageMemoryBind *)&imageMipTailMemoryBind);
                          }
                          else {
                            (imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->memoryOffset =
                                 *(VkDeviceSize *)(imageMipTailBindInfo.image.m_internal + 0x10);
                            *(ulong *)&(imageResidencyMemoryBinds.
                                        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->flags =
                                 uStack_870;
                            *(undefined8 *)
                             &((imageResidencyMemoryBinds.
                                super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->extent).depth =
                                 imageMipTailMemoryBind._32_8_;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->memory).m_internal =
                                 dVar7;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset).y =
                                 local_8b0 * uVar4;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset).z =
                                 local_8b4 * uVar5;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->extent).width = uVar9;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->extent).height = uVar36;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->subresource).aspectMask =
                                 dVar17;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->subresource).mipLevel =
                                 dVar32;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->subresource).arrayLayer =
                                 (deUint32)local_7f0;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset).x = iVar38;
                            imageResidencyMemoryBinds.
                            super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_finish =
                                 imageResidencyMemoryBinds.
                                 super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 1;
                          }
                          if (imageMipTailBindInfo._8_8_ != 0) {
                            LOCK();
                            piVar1 = (int *)(imageMipTailBindInfo._8_8_ + 8);
                            *piVar1 = *piVar1 + -1;
                            UNLOCK();
                            if (*piVar1 == 0) {
                              imageMipTailBindInfo.image.m_internal = 0;
                              (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 0x10))();
                            }
                            LOCK();
                            piVar1 = (int *)(imageMipTailBindInfo._8_8_ + 0xc);
                            *piVar1 = *piVar1 + -1;
                            UNLOCK();
                            if ((*piVar1 == 0) && (imageMipTailBindInfo._8_8_ != 0)) {
                              (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 8))();
                            }
                          }
                          uVar30 = uVar30 + 1;
                          iVar38 = iVar38 + uVar18;
                        } while (uVar30 < uVar21);
                      }
                      local_8b0 = local_8b0 + 1;
                    } while (local_8b0 < uVar28);
                  }
                  local_8b4 = local_8b4 + 1;
                } while (local_8b4 < uVar34);
              }
              dVar32 = dVar32 + 1;
            } while (dVar32 != dVar19);
          }
          VVar11 = local_5e8;
          if ((imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_finish ==
               imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_start) || ((uVar6 & 1) == 0)) {
            imageResidencyBindInfo.image.m_internal = local_5e8;
            imageResidencyBindInfo._8_8_ = submitInfo.pNext;
            imageResidencyBindInfo.pBinds =
                 (VkSparseImageMemoryBind *)
                 CONCAT44(imageResidencyBindInfo.pBinds._4_4_,submitInfo.waitSemaphoreCount);
            (*this->m_memAlloc->_vptr_Allocator[3])
                      (&imageMipTailMemoryBind,this->m_memAlloc,&imageResidencyBindInfo,0);
            VVar12 = imageMipTailMemoryBind.resourceOffset;
            imageMipTailMemoryBind.resourceOffset = 0;
            imageMipTailBindInfo.bindCount = 0;
            imageMipTailBindInfo._12_4_ = 0;
            imageMipTailBindInfo.image.m_internal = VVar12;
            imageMipTailBindInfo._8_8_ = operator_new(0x20);
            *(undefined4 *)(imageMipTailBindInfo._8_8_ + 8) = 0;
            *(undefined4 *)(imageMipTailBindInfo._8_8_ + 0xc) = 0;
            *(undefined ***)imageMipTailBindInfo._8_8_ = &PTR__SharedPtrState_00d265f8;
            *(VkDeviceSize *)(imageMipTailBindInfo._8_8_ + 0x10) = VVar12;
            *(undefined4 *)(imageMipTailBindInfo._8_8_ + 8) = 1;
            *(undefined4 *)(imageMipTailBindInfo._8_8_ + 0xc) = 1;
            imageMipTailMemoryBind.resourceOffset = local_5f8 * local_7f0 + local_5f0;
            imageMipTailMemoryBind.size = VVar11;
            imageMipTailMemoryBind.memory.m_internal = *(deUint64 *)(VVar12 + 8);
            imageMipTailMemoryBind.memoryOffset = *(VkDeviceSize *)(VVar12 + 0x10);
            imageMipTailMemoryBind._32_8_ = imageMipTailMemoryBind._32_8_ & 0xffffffff00000000;
            std::
            vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
            push_back(&this->m_allocations,(value_type *)&imageMipTailBindInfo);
            if (imageMipTailMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                imageMipTailMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
              _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                        ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>> *)
                         &imageMipTailMemoryBinds,
                         (iterator)
                         imageMipTailMemoryBinds.
                         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&imageMipTailMemoryBind);
            }
            else {
              (imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_finish)->flags = imageMipTailMemoryBind.flags;
              *(undefined4 *)
               &(imageMipTailMemoryBinds.
                 super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x24 =
                   imageMipTailMemoryBind._36_4_;
              ((imageMipTailMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_finish)->memory).m_internal =
                   imageMipTailMemoryBind.memory.m_internal;
              (imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_finish)->memoryOffset =
                   imageMipTailMemoryBind.memoryOffset;
              *(undefined4 *)
               &(imageMipTailMemoryBinds.
                 super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->resourceOffset =
                   (undefined4)imageMipTailMemoryBind.resourceOffset;
              *(undefined4 *)
               ((long)&(imageMipTailMemoryBinds.
                        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->resourceOffset + 4) =
                   imageMipTailMemoryBind.resourceOffset._4_4_;
              *(undefined4 *)
               &(imageMipTailMemoryBinds.
                 super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->size =
                   (undefined4)imageMipTailMemoryBind.size;
              *(undefined4 *)
               ((long)&(imageMipTailMemoryBinds.
                        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->size + 4) =
                   imageMipTailMemoryBind.size._4_4_;
              imageMipTailMemoryBinds.
              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   imageMipTailMemoryBinds.
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if (imageMipTailBindInfo._8_8_ != 0) {
              LOCK();
              piVar1 = (int *)(imageMipTailBindInfo._8_8_ + 8);
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                imageMipTailBindInfo.image.m_internal = 0;
                (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 0x10))();
              }
              LOCK();
              piVar1 = (int *)(imageMipTailBindInfo._8_8_ + 0xc);
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if ((*piVar1 == 0) && (imageMipTailBindInfo._8_8_ != 0)) {
                (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 8))();
              }
            }
          }
          local_7f0 = local_7f0 + 1;
        } while (local_7f0 != local_5e0);
        if ((long)imageResidencyMemoryBinds.
                  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)imageResidencyMemoryBinds.
                  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          imageResidencyBindInfo.image = sparseImage;
          imageResidencyBindInfo.bindCount =
               (deUint32)
               ((ulong)((long)imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6);
          imageResidencyBindInfo.pBinds =
               imageResidencyMemoryBinds.
               super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      imageMipTailMemoryBind.resourceOffset = 7;
      imageMipTailMemoryBind.flags = 0;
      imageMipTailMemoryBind._36_4_ = 0;
      imageMipTailMemoryBind.memoryOffset = 0;
      imageMipTailMemoryBind.memory.m_internal = 0;
      imageMipTailMemoryBind.size = 0;
      if ((long)imageMipTailMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)imageMipTailMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        imageMipTailBindInfo.image = sparseImage;
        imageMipTailBindInfo.bindCount =
             (int)((ulong)((long)imageMipTailMemoryBinds.
                                 super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)imageMipTailMemoryBinds.
                                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
        imageMipTailBindInfo.pBinds =
             imageMipTailMemoryBinds.
             super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      VVar22 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])
                         (vk,local_730,1,&imageMipTailMemoryBind,0);
      ::vk::checkResult(VVar22,"vk.queueBindSparse(queue, 1u, &bindSparseInfo, DE_NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                        ,0x661);
      if (imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(imageMipTailMemoryBinds.
                        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)imageMipTailMemoryBinds.
                              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)imageMipTailMemoryBinds.
                              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (imageResidencyMemoryBinds.
          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(imageResidencyMemoryBinds.
                        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pvVar10 = (void *)CONCAT44(bufferParams._4_4_,bufferParams.sType);
      if (pvVar10 != (void *)0x0) {
        operator_delete(pvVar10,CONCAT44(bufferParams._20_4_,bufferParams.flags) - (long)pvVar10);
      }
      if (sparseImageMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(sparseImageMemoryRequirements.
                        super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)sparseImageMemoryRequirements.
                              super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)sparseImageMemoryRequirements.
                              super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      imageResidencyBindInfo.pBinds = (VkSparseImageMemoryBind *)0x0;
      imageResidencyBindInfo.image.m_internal = 0;
      imageResidencyBindInfo.bindCount = 0;
      imageResidencyBindInfo._12_4_ = 0;
      imageMipTailBindInfo.pBinds = (VkSparseMemoryBind *)0x0;
      imageMipTailBindInfo.image.m_internal = 0;
      imageMipTailBindInfo.bindCount = 0;
      imageMipTailBindInfo._12_4_ = 0;
      ::vk::createCommandPool
                ((Move<vk::Handle<(vk::HandleType)24>_> *)&sparseImageMemoryRequirements,
                 &vk->super_DeviceInterface,local_848,1,dVar23,(VkAllocationCallbacks *)0x0);
      pVVar15 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pVVar14 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pVVar13 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start;
      imageMipTailMemoryBind.memory.m_internal =
           (deUint64)
           sparseImageMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      imageMipTailMemoryBind.resourceOffset =
           (VkDeviceSize)
           sparseImageMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_start;
      imageMipTailMemoryBind.size =
           (VkDeviceSize)
           sparseImageMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      sparseImageMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sparseImageMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sparseImageMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (imageResidencyBindInfo.image.m_internal == 0) {
        imageResidencyBindInfo.pBinds = (VkSparseImageMemoryBind *)pVVar15;
        imageResidencyBindInfo.image.m_internal = (deUint64)pVVar13;
        imageResidencyBindInfo._8_8_ = pVVar14;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&imageResidencyBindInfo.bindCount,
                   (VkCommandPool)imageResidencyBindInfo.image.m_internal);
        imageResidencyBindInfo.image.m_internal = imageMipTailMemoryBind.resourceOffset;
        imageResidencyBindInfo._8_8_ = imageMipTailMemoryBind.size;
        imageResidencyBindInfo.pBinds =
             (VkSparseImageMemoryBind *)imageMipTailMemoryBind.memory.m_internal;
        if (sparseImageMemoryRequirements.
            super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
                     &sparseImageMemoryRequirements.
                      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                     (VkCommandPool)
                     sparseImageMemoryRequirements.
                     super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      ::vk::allocateCommandBuffer
                ((Move<vk::VkCommandBuffer_s_*> *)&sparseImageMemoryRequirements,
                 &vk->super_DeviceInterface,local_848,
                 (VkCommandPool)imageResidencyBindInfo.image.m_internal,
                 VK_COMMAND_BUFFER_LEVEL_PRIMARY);
      pVVar15 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pVVar14 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pVVar13 = sparseImageMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start;
      imageMipTailMemoryBind.memory.m_internal =
           (deUint64)
           sparseImageMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      imageMipTailMemoryBind.memoryOffset = 0;
      imageMipTailMemoryBind.resourceOffset =
           (VkDeviceSize)
           sparseImageMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_start;
      imageMipTailMemoryBind.size =
           (VkDeviceSize)
           sparseImageMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      sparseImageMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sparseImageMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sparseImageMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (imageMipTailBindInfo.image.m_internal == 0) {
        imageMipTailBindInfo.pBinds = (VkSparseMemoryBind *)pVVar15;
        VStack_8d0 = 0;
        imageMipTailBindInfo.image.m_internal = (deUint64)pVVar13;
        imageMipTailBindInfo._8_8_ = pVVar14;
      }
      else {
        submitInfo._0_8_ = imageMipTailBindInfo.image.m_internal;
        (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 0x240))
                  (imageMipTailBindInfo._8_8_,imageMipTailBindInfo.pBinds,0,1);
        imageMipTailBindInfo.image.m_internal = imageMipTailMemoryBind.resourceOffset;
        imageMipTailBindInfo._8_8_ = imageMipTailMemoryBind.size;
        imageMipTailBindInfo.pBinds = (VkSparseMemoryBind *)imageMipTailMemoryBind.memory.m_internal
        ;
        VStack_8d0 = imageMipTailMemoryBind.memoryOffset;
        if (sparseImageMemoryRequirements.
            super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          imageMipTailMemoryBind.resourceOffset =
               (VkDeviceSize)
               sparseImageMemoryRequirements.
               super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (**(code **)(*(long *)&(sparseImageMemoryRequirements.
                                  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->formatProperties +
                      0x240))(sparseImageMemoryRequirements.
                              super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              sparseImageMemoryRequirements.
                              super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,0,1);
        }
      }
      bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      bufferParams.pNext = (void *)0x0;
      bufferParams.flags = 0;
      bufferParams.size = local_728;
      bufferParams.usage = 1;
      bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      bufferParams.queueFamilyIndexCount = 0;
      bufferParams.pQueueFamilyIndices = (deUint32 *)0x0;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&sparseMemoryReqCount,
                         &vk->super_DeviceInterface,local_848,&bufferParams,
                         (VkAllocationCallbacks *)0x0);
      pAVar8 = this->m_memAlloc;
      buffer.m_internal._4_4_ = uStack_684;
      buffer.m_internal._0_4_ = sparseMemoryReqCount;
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&imageMipTailMemoryBind,&vk->super_DeviceInterface,
                 local_848,buffer);
      (*pAVar8->_vptr_Allocator[3])(local_628,pAVar8,&imageMipTailMemoryBind,1);
      VVar22 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0xc])
                         (vk,local_848,CONCAT44(uStack_684,sparseMemoryReqCount),local_628[0][1],
                          local_628[0][2]);
      ::vk::checkResult(VVar22,
                        "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                        ,0x67c);
      imageResidencyMemoryBinds.
      super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2c);
      dVar23 = 0;
      imageResidencyMemoryBinds.
      super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      imageResidencyMemoryBinds.
      super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x80000004000;
      imageMipTailMemoryBind.resourceOffset =
           CONCAT44(imageMipTailMemoryBind.resourceOffset._4_4_,0x2d);
      imageMipTailMemoryBind.size = 0;
      imageMipTailMemoryBind.memory.m_internal = 0x100000000000;
      imageMipTailMemoryBind.memoryOffset = 0x700000000;
      imageMipTailMemoryBind.flags = 0xffffffff;
      imageMipTailMemoryBind._36_4_ = 0xffffffff;
      sparseImageMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(sparseImageMemoryRequirements.
                             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2d);
      sparseImageMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sparseImageMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2000001000;
      cmdBufferBeginInfo.flags = 1;
      cmdBufferBeginInfo._20_4_ = 0;
      cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
      cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
      cmdBufferBeginInfo._4_4_ = 0;
      cmdBufferBeginInfo.pNext = (void *)0x0;
      copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar26 = (textureData->
                super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar24 = (textureData->
                super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar24 != pvVar26) {
        lVar42 = local_628[0][3];
        uVar39 = 0;
        do {
          pCVar40 = pvVar26[uVar39].
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pvVar26[uVar39].
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_finish != pCVar40) {
            lVar33 = 8;
            uVar43 = 0;
            do {
              dVar23 = sr::anon_unknown_0::getNextMultiple
                                 ((anon_unknown_0 *)
                                  offsetMultiples.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  offsetMultiples.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish,dVar23);
              format = (TextureFormat *)((long)(pCVar40->m_size).m_data + lVar33 + -0x10);
              uVar41 = (ulong)dVar23;
              tcu::PixelBufferAccess::PixelBufferAccess
                        ((PixelBufferAccess *)&imageMipTailMemoryBinds,format,
                         (IVec3 *)((long)(pCVar40->m_size).m_data + lVar33 + -8),
                         (void *)(lVar42 + uVar41));
              submitInfo.pNext =
                   (void *)CONCAT44(*(undefined4 *)((long)(pCVar40->m_size).m_data + lVar33 + -4),
                                    *(undefined4 *)((long)(pCVar40->m_size).m_data + lVar33 + -8));
              submitInfo._20_4_ = SUB84(uVar39,0);
              submitInfo.pWaitSemaphores._0_4_ = (undefined4)uVar43;
              submitInfo.pWaitSemaphores._4_4_ = 1;
              submitInfo.pWaitDstStageMask._0_4_ = 0;
              submitInfo.pWaitDstStageMask._4_4_ = 0;
              submitInfo.commandBufferCount = 0;
              submitInfo._44_4_ = *(uint *)((long)(pCVar40->m_size).m_data + lVar33 + -8);
              submitInfo.pCommandBuffers =
                   (VkCommandBuffer *)
                   CONCAT44(*(undefined4 *)((long)(pCVar40->m_size).m_data + lVar33),
                            *(undefined4 *)((long)(pCVar40->m_size).m_data + lVar33 + -4));
              submitInfo._0_8_ = uVar41;
              submitInfo.waitSemaphoreCount = dVar17;
              if (copyRegions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  copyRegions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>>::
                _M_realloc_insert<vk::VkBufferImageCopy_const&>
                          ((vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>> *)
                           &copyRegions,
                           (iterator)
                           copyRegions.
                           super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (VkBufferImageCopy *)&submitInfo);
              }
              else {
                *(VkCommandBuffer **)
                 &((copyRegions.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->imageExtent).height =
                     submitInfo.pCommandBuffers;
                ((copyRegions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->imageOffset).x = 0;
                ((copyRegions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->imageOffset).y = 0;
                *(ulong *)&((copyRegions.
                             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->imageOffset).z =
                     (ulong)(uint)submitInfo._44_4_ << 0x20;
                ((copyRegions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).aspectMask = dVar17;
                ((copyRegions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).mipLevel =
                     submitInfo._20_4_;
                ((copyRegions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).baseArrayLayer =
                     submitInfo.pWaitSemaphores._0_4_;
                ((copyRegions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).layerCount = 1;
                (copyRegions.
                 super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->bufferOffset = uVar41;
                *(void **)&(copyRegions.
                            super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->bufferRowLength =
                     submitInfo.pNext;
                copyRegions.
                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     copyRegions.
                     super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              tcu::copy((EVP_PKEY_CTX *)&imageMipTailMemoryBinds,(EVP_PKEY_CTX *)format);
              iVar38 = *(int *)((long)(pCVar40->m_size).m_data + lVar33 + -8);
              iVar2 = *(int *)((long)(pCVar40->m_size).m_data + lVar33 + -4);
              iVar3 = *(int *)((long)(pCVar40->m_size).m_data + lVar33);
              iVar20 = tcu::TextureFormat::getPixelSize(format);
              dVar23 = iVar3 * iVar20 * iVar2 * iVar38 + dVar23;
              uVar43 = uVar43 + 1;
              pCVar40 = pvVar26[uVar39].
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar33 = lVar33 + 0x28;
            } while (uVar43 < (ulong)(((long)pvVar26[uVar39].
                                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pCVar40 >> 3) * -0x3333333333333333));
            pvVar26 = (textureData->
                      super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pvVar24 = (textureData->
                      super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 < (ulong)(((long)pvVar24 - (long)pvVar26 >> 3) * -0x5555555555555555));
      }
      VVar22 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x49])
                         (vk,imageMipTailBindInfo.image.m_internal,&cmdBufferBeginInfo);
      ::vk::checkResult(VVar22,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                        ,0x6e9);
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                (vk,imageMipTailBindInfo.image.m_internal,0x4000,0x1000,0,0,0,1,
                 &imageResidencyMemoryBinds,1,&imageMipTailMemoryBind);
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x62])
                (vk,imageMipTailBindInfo.image.m_internal,CONCAT44(uStack_684,sparseMemoryReqCount),
                 sparseImage.m_internal,7,
                 (ulong)(uint)((int)((ulong)((long)copyRegions.
                                                                                                      
                                                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)copyRegions.
                                                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                              -0x49249249),
                 copyRegions.
                 super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                (vk,imageMipTailBindInfo.image.m_internal,0x1000,1,0,0,0,0,0,1,
                 &sparseImageMemoryRequirements);
      VVar22 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x4a])
                         (vk,imageMipTailBindInfo.image.m_internal);
      ::vk::checkResult(VVar22,"vk.endCommandBuffer(*cmdBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                        ,0x6ed);
      submitInfo.pWaitDstStageMask = &pipelineStageFlags;
      pipelineStageFlags = 0x8000;
      submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
      submitInfo.pNext = (void *)0x0;
      submitInfo.waitSemaphoreCount = 1;
      submitInfo.pWaitSemaphores = &local_618;
      submitInfo.commandBufferCount = 1;
      submitInfo.signalSemaphoreCount = 0;
      submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
      submitInfo.pCommandBuffers = (VkCommandBuffer *)&imageMipTailBindInfo;
      ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&imageMipTailMemoryBinds,
                        &vk->super_DeviceInterface,local_848,0,(VkAllocationCallbacks *)0x0);
      VVar22 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[2])
                         (vk,local_730,1,&submitInfo,
                          imageMipTailMemoryBinds.
                          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      ::vk::checkResult(VVar22,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                        ,0x702);
      VVar22 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x16])
                         (vk,local_848,1,&imageMipTailMemoryBinds,1,0xffffffffffffffff);
      ::vk::checkResult(VVar22,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                        ,0x703);
      if (imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
                   &imageMipTailMemoryBinds.
                    super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                   (VkFence)imageMipTailMemoryBinds.
                            super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      }
      if (copyRegions.
          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(copyRegions.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)copyRegions.
                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)copyRegions.
                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_628[0] != (long *)0x0) {
        (**(code **)(*local_628[0] + 8))();
      }
      obj.m_internal._4_4_ = uStack_684;
      obj.m_internal._0_4_ = sparseMemoryReqCount;
      if (obj.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&local_680,obj);
      }
      if (imageMipTailBindInfo.image.m_internal != 0) {
        imageMipTailMemoryBind.resourceOffset = imageMipTailBindInfo.image.m_internal;
        (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 0x240))
                  (imageMipTailBindInfo._8_8_,imageMipTailBindInfo.pBinds,VStack_8d0,1);
      }
      if (imageResidencyBindInfo.image.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&imageResidencyBindInfo.bindCount,
                   (VkCommandPool)imageResidencyBindInfo.image.m_internal);
      }
      if (offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(offsetMultiples.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)offsetMultiples.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)offsetMultiples.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_618.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()(&DStack_610,local_618)
        ;
      }
      return;
    }
    pNVar25 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar25,"Required memory size for sparse resource exceeds device limits.",(char *)0x0
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x5d5);
    goto LAB_0065389e;
  }
  uVar39 = uVar39 + 1;
  if (dVar19 <= uVar39) {
LAB_00653873:
    pNVar25 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar25,"No matching memory type found.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x5d2);
LAB_0065389e:
    __cxa_throw(pNVar25,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  goto LAB_0065383d;
}

Assistant:

void ShaderRenderCaseInstance::uploadSparseImage (const tcu::TextureFormat&		texFormat,
												  const TextureData&			textureData,
												  const tcu::Sampler&			refSampler,
												  const deUint32				mipLevels,
												  const deUint32				arrayLayers,
												  const VkImage					sparseImage,
												  const VkImageCreateInfo&		imageCreateInfo,
												  const tcu::UVec3				texSize)
{
	const VkDevice							vkDevice				= getDevice();
	const DeviceInterface&					vk						= getDeviceInterface();
	const VkPhysicalDevice					physicalDevice			= getPhysicalDevice();
	const VkQueue							queue					= getUniversalQueue();
	const deUint32							queueFamilyIndex		= getUniversalQueueFamilyIndex();
	const InstanceInterface&				instance				= getInstanceInterface();
	const VkPhysicalDeviceProperties		deviceProperties		= getPhysicalDeviceProperties(instance, physicalDevice);
	const VkPhysicalDeviceMemoryProperties	deviceMemoryProperties	= getPhysicalDeviceMemoryProperties(instance, physicalDevice);
	const bool								isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags				aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;

	const Unique<VkSemaphore>				imageMemoryBindSemaphore(createSemaphore(vk, vkDevice));
	deUint32								bufferSize				= 0u;
	std::vector<deUint32>					offsetMultiples;
	offsetMultiples.push_back(4u);
	offsetMultiples.push_back(texFormat.getPixelSize());

	if (isImageSizeSupported(imageCreateInfo.imageType, texSize, deviceProperties.limits) == false)
		TCU_THROW(NotSupportedError, "Image size not supported for device.");

	// Calculate buffer size
	for (TextureData::const_iterator mit = textureData.begin(); mit != textureData.end(); ++mit)
	{
		for (TextureLayerData::const_iterator lit = mit->begin(); lit != mit->end(); ++lit)
		{
			const tcu::ConstPixelBufferAccess&	access	= *lit;

			bufferSize = getNextMultiple(offsetMultiples, bufferSize);
			bufferSize += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
		}
	}

	{
		deUint32 sparseMemoryReqCount = 0;

		vk.getImageSparseMemoryRequirements(vkDevice, sparseImage, &sparseMemoryReqCount, DE_NULL);

		DE_ASSERT(sparseMemoryReqCount != 0);

		std::vector<VkSparseImageMemoryRequirements> sparseImageMemoryRequirements;
		sparseImageMemoryRequirements.resize(sparseMemoryReqCount);

		vk.getImageSparseMemoryRequirements(vkDevice, sparseImage, &sparseMemoryReqCount, &sparseImageMemoryRequirements[0]);

		const deUint32 noMatchFound = ~((deUint32)0);

		deUint32 colorAspectIndex = noMatchFound;
		for (deUint32 memoryReqNdx = 0; memoryReqNdx < sparseMemoryReqCount; ++memoryReqNdx)
		{
			if (sparseImageMemoryRequirements[memoryReqNdx].formatProperties.aspectMask & VK_IMAGE_ASPECT_COLOR_BIT)
			{
				colorAspectIndex = memoryReqNdx;
				break;
			}
		}

		if (colorAspectIndex == noMatchFound)
			TCU_THROW(NotSupportedError, "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT.");

		const VkMemoryRequirements	memoryRequirements	= getImageMemoryRequirements(vk, vkDevice, sparseImage);

		deUint32 memoryType = noMatchFound;
		for (deUint32 memoryTypeNdx = 0; memoryTypeNdx < deviceMemoryProperties.memoryTypeCount; ++memoryTypeNdx)
		{
			if ((memoryRequirements.memoryTypeBits & (1u << memoryTypeNdx)) != 0 &&
				MemoryRequirement::Any.matchesHeap(deviceMemoryProperties.memoryTypes[memoryTypeNdx].propertyFlags))
			{
				memoryType = memoryTypeNdx;
				break;
			}
		}

		if (memoryType == noMatchFound)
			TCU_THROW(NotSupportedError, "No matching memory type found.");

		if (memoryRequirements.size > deviceProperties.limits.sparseAddressSpaceSize)
			TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits.");

		// Check if the image format supports sparse oprerations
		const std::vector<VkSparseImageFormatProperties> sparseImageFormatPropVec =
			getPhysicalDeviceSparseImageFormatProperties(instance, physicalDevice, imageCreateInfo.format, imageCreateInfo.imageType, imageCreateInfo.samples, imageCreateInfo.usage, imageCreateInfo.tiling);

		if (sparseImageFormatPropVec.size() == 0)
			TCU_THROW(NotSupportedError, "The image format does not support sparse operations.");

		const VkSparseImageMemoryRequirements		aspectRequirements	= sparseImageMemoryRequirements[colorAspectIndex];
		const VkExtent3D							imageGranularity	= aspectRequirements.formatProperties.imageGranularity;

		std::vector<VkSparseImageMemoryBind>		imageResidencyMemoryBinds;
		std::vector<VkSparseMemoryBind>				imageMipTailMemoryBinds;

		for (deUint32 layerNdx = 0; layerNdx < arrayLayers; ++ layerNdx)
		{
			for (deUint32 mipLevelNdx = 0; mipLevelNdx < aspectRequirements.imageMipTailFirstLod; ++mipLevelNdx)
			{
				const VkExtent3D	mipExtent		= mipLevelExtents(imageCreateInfo.extent, mipLevelNdx);
				const tcu::UVec3	numSparseBinds	= alignedDivide(mipExtent, imageGranularity);
				const tcu::UVec3	lastBlockExtent	= tcu::UVec3(mipExtent.width  % imageGranularity.width  ? mipExtent.width  % imageGranularity.width  : imageGranularity.width,
																 mipExtent.height % imageGranularity.height ? mipExtent.height % imageGranularity.height : imageGranularity.height,
																 mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth  % imageGranularity.depth  : imageGranularity.depth );

				for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
				for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
				for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
				{
					const VkMemoryRequirements allocRequirements =
					{
						// 28.7.5 alignment shows the block size in bytes
						memoryRequirements.alignment,		// VkDeviceSize	size;
						memoryRequirements.alignment,		// VkDeviceSize	alignment;
						memoryRequirements.memoryTypeBits,	// uint32_t		memoryTypeBits;
					};

					de::SharedPtr<Allocation> allocation(m_memAlloc.allocate(allocRequirements, MemoryRequirement::Any).release());

					m_allocations.push_back(allocation);

					VkOffset3D offset;
					offset.x = x*imageGranularity.width;
					offset.y = y*imageGranularity.height;
					offset.z = z*imageGranularity.depth;

					VkExtent3D extent;
					extent.width	= (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
					extent.height	= (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
					extent.depth	= (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

					const VkSparseImageMemoryBind imageMemoryBind =
					{
						{
							aspectMask,	// VkImageAspectFlags	aspectMask;
							mipLevelNdx,// uint32_t				mipLevel;
							layerNdx,	// uint32_t				arrayLayer;
						},							// VkImageSubresource		subresource;
						offset,						// VkOffset3D				offset;
						extent,						// VkExtent3D				extent;
						allocation->getMemory(),	// VkDeviceMemory			memory;
						allocation->getOffset(),	// VkDeviceSize				memoryOffset;
						0u,							// VkSparseMemoryBindFlags	flags;
					};

					imageResidencyMemoryBinds.push_back(imageMemoryBind);
				}
			}

			// Handle MIP tail. There are two cases to consider here:
			//
			// 1) VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT is requested by the driver: each layer needs a separate tail.
			// 2) otherwise:                                                            only one tail is needed.
			{
				if ( imageMipTailMemoryBinds.size() == 0                                                                                                   ||
					(imageMipTailMemoryBinds.size() != 0 && (aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) == 0))
				{
					const VkMemoryRequirements allocRequirements =
					{
						aspectRequirements.imageMipTailSize,	// VkDeviceSize	size;
						memoryRequirements.alignment,			// VkDeviceSize	alignment;
						memoryRequirements.memoryTypeBits,		// uint32_t		memoryTypeBits;
					};

					const de::SharedPtr<Allocation> allocation(m_memAlloc.allocate(allocRequirements, MemoryRequirement::Any).release());

					const VkSparseMemoryBind imageMipTailMemoryBind =
					{
						aspectRequirements.imageMipTailOffset + layerNdx * aspectRequirements.imageMipTailStride,	// VkDeviceSize					resourceOffset;
						aspectRequirements.imageMipTailSize,														// VkDeviceSize					size;
						allocation->getMemory(),																	// VkDeviceMemory				memory;
						allocation->getOffset(),																	// VkDeviceSize					memoryOffset;
						0u,																							// VkSparseMemoryBindFlags		flags;
					};

					m_allocations.push_back(allocation);
					imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
				}
			}
		}

		VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		VkSparseImageMemoryBindInfo			imageResidencyBindInfo;
		VkSparseImageOpaqueMemoryBindInfo	imageMipTailBindInfo;

		if (imageResidencyMemoryBinds.size() > 0)
		{
			imageResidencyBindInfo.image		= sparseImage;
			imageResidencyBindInfo.bindCount	= static_cast<deUint32>(imageResidencyMemoryBinds.size());
			imageResidencyBindInfo.pBinds		= &imageResidencyMemoryBinds[0];

			bindSparseInfo.imageBindCount		= 1u;
			bindSparseInfo.pImageBinds			= &imageResidencyBindInfo;
		}

		if (imageMipTailMemoryBinds.size() > 0)
		{
			imageMipTailBindInfo.image = sparseImage;
			imageMipTailBindInfo.bindCount = static_cast<deUint32>(imageMipTailMemoryBinds.size());
			imageMipTailBindInfo.pBinds = &imageMipTailMemoryBinds[0];

			bindSparseInfo.imageOpaqueBindCount = 1u;
			bindSparseInfo.pImageOpaqueBinds = &imageMipTailBindInfo;
		}

		VK_CHECK(vk.queueBindSparse(queue, 1u, &bindSparseInfo, DE_NULL));
	}

	Move<VkCommandPool>		cmdPool;
	Move<VkCommandBuffer>	cmdBuffer;

	// Create command pool
	cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);

	// Create command buffer
	cmdBuffer = allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create source buffer
	const VkBufferCreateInfo bufferParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		bufferSize,									// VkDeviceSize			size;
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		0u,											// deUint32				queueFamilyIndexCount;
		DE_NULL,									// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>					buffer		= createBuffer(vk, vkDevice, &bufferParams);
	de::MovePtr<Allocation>			bufferAlloc = m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier preBufferBarrier =
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		bufferSize									// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		sparseImage,									// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		sparseImage,									// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	std::vector<VkBufferImageCopy>	copyRegions;
	// Get copy regions and write buffer data
	{
		deUint32	layerDataOffset		= 0;
		deUint8*	destPtr				= (deUint8*)bufferAlloc->getHostPtr();

		for (size_t levelNdx = 0; levelNdx < textureData.size(); levelNdx++)
		{
			const TextureLayerData&		layerData	= textureData[levelNdx];

			for (size_t layerNdx = 0; layerNdx < layerData.size(); layerNdx++)
			{
				layerDataOffset = getNextMultiple(offsetMultiples, layerDataOffset);

				const tcu::ConstPixelBufferAccess&	access		= layerData[layerNdx];
				const tcu::PixelBufferAccess		destAccess	(access.getFormat(), access.getSize(), destPtr + layerDataOffset);

				const VkBufferImageCopy				layerRegion =
				{
					layerDataOffset,						// VkDeviceSize				bufferOffset;
					(deUint32)access.getWidth(),			// deUint32					bufferRowLength;
					(deUint32)access.getHeight(),			// deUint32					bufferImageHeight;
					{										// VkImageSubresourceLayers	imageSubresource;
						aspectMask,								// VkImageAspectFlags		aspectMask;
						(deUint32)levelNdx,						// uint32_t					mipLevel;
						(deUint32)layerNdx,						// uint32_t					baseArrayLayer;
						1u										// uint32_t					layerCount;
					},
					{ 0u, 0u, 0u },							// VkOffset3D			imageOffset;
					{										// VkExtent3D			imageExtent;
						(deUint32)access.getWidth(),
						(deUint32)access.getHeight(),
						(deUint32)access.getDepth()
					}
				};

				copyRegions.push_back(layerRegion);
				tcu::copy(destAccess, access);

				layerDataOffset += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
			}
		}
	}

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &preBufferBarrier, 1, &preImageBarrier);
	vk.cmdCopyBufferToImage(*cmdBuffer, *buffer, sparseImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copyRegions.size(), copyRegions.data());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkPipelineStageFlags pipelineStageFlags = VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT;

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType				sType;
		DE_NULL,								// const void*					pNext;
		1u,										// deUint32						waitSemaphoreCount;
		&imageMemoryBindSemaphore.get(),		// const VkSemaphore*			pWaitSemaphores;
		&pipelineStageFlags,					// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,										// deUint32						commandBufferCount;
		&cmdBuffer.get(),						// const VkCommandBuffer*		pCommandBuffers;
		0u,										// deUint32						signalSemaphoreCount;
		DE_NULL									// const VkSemaphore*			pSignalSemaphores;
	};

	Move<VkFence>	fence = createFence(vk, vkDevice);

	try
	{
		VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
	}
	catch (...)
	{
		VK_CHECK(vk.deviceWaitIdle(vkDevice));
		throw;
	}
}